

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pusher.cpp
# Opt level: O1

void push_boris(particle *p,vector3d *e_field,vector3d *b_field,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong local_40;
  
  dVar12 = dt * 0.5 * p->cmr;
  dVar2 = dVar12 * e_field->x;
  dVar3 = dVar12 * e_field->y;
  dVar4 = dVar12 * e_field->z;
  dVar13 = dVar2 + p->ux;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = p->uy;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar7 = vaddsd_avx512f(auVar10,auVar8);
  dVar1 = dVar4 + p->uz;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar13;
  auVar8 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar32,auVar32);
  auVar8 = vfmadd231sd_avx512f(auVar8,auVar7,auVar7);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar9);
  if (auVar8._0_8_ < 0.0) {
    vmovsd_avx512f(auVar7);
    dVar11 = sqrt(auVar8._0_8_);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_40;
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar11 = auVar8._0_8_;
  }
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar13;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  p->g = dVar11;
  dVar12 = dVar12 / dVar11;
  dVar5 = dVar12 * b_field->x;
  dVar6 = dVar12 * b_field->y;
  dVar12 = dVar12 * b_field->z;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar12;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 * dVar6;
  auVar8 = vfmsub231sd_avx512f(auVar23,auVar7,auVar14);
  dVar11 = dVar13 + auVar8._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar13 * dVar12;
  auVar8 = vfmsub231sd_fma(auVar25,auVar30,auVar17);
  auVar9 = vaddsd_avx512f(auVar7,auVar8);
  auVar8 = vmulsd_avx512f(auVar17,auVar7);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6;
  auVar8 = vfmsub231sd_fma(auVar8,auVar31,auVar21);
  dVar1 = dVar1 + auVar8._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar12 * dVar11;
  auVar10 = vfmsub231sd_fma(auVar28,auVar18,auVar26);
  auVar8 = vfmadd213sd_fma(auVar18,auVar18,ZEXT816(0x3ff0000000000000));
  auVar8 = vfmadd231sd_fma(auVar8,auVar21,auVar21);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar12;
  auVar8 = vfmadd231sd_fma(auVar8,auVar14,auVar15);
  auVar19._0_8_ = 2.0 / auVar8._0_8_;
  auVar19._8_8_ = 0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar6 * dVar1;
  auVar8 = vfmsub231sd_fma(auVar27,auVar9,auVar15);
  auVar8 = vfmadd213sd_fma(auVar8,auVar19,auVar31);
  auVar10 = vfmadd213sd_avx512f(auVar10,auVar19,auVar7);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar11;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar5 * auVar9._0_8_;
  auVar7 = vfmsub231sd_fma(auVar29,auVar24,auVar21);
  auVar7 = vfmadd213sd_fma(auVar7,auVar19,auVar30);
  dVar2 = dVar2 + auVar8._0_8_;
  p->ux = dVar2;
  dVar3 = dVar3 + auVar10._0_8_;
  p->uy = dVar3;
  dVar4 = dVar4 + auVar7._0_8_;
  p->uz = dVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  auVar8 = vfmadd213sd_fma(auVar16,auVar16,ZEXT816(0x3ff0000000000000));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar3;
  auVar8 = vfmadd231sd_fma(auVar8,auVar20,auVar20);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar4;
  auVar8 = vfmadd231sd_fma(auVar8,auVar22,auVar22);
  if (auVar8._0_8_ < 0.0) {
    dVar13 = sqrt(auVar8._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar13 = auVar8._0_8_;
  }
  p->g = dVar13;
  return;
}

Assistant:

void push_boris(particle & p, vector3d& e_field, vector3d& b_field, double dt)
{
    // See Birdsall, Langdon, "Plasma Physics via Computer Simulation"
    vector3d e;
    vector3d b;
    double tmp;
    double u1x, u1y, u1z;
    double wx,wy,wz;
    double & cmr = p.cmr;
    double & ux = p.ux;
    double & uy = p.uy;
    double & uz = p.uz;
    double & g = p.g;
    tmp = 0.5 * dt * cmr;

    //e = dt qE/2m
    e.x = e_field.x*tmp;
    e.y = e_field.y*tmp;
    e.z = e_field.z*tmp;
    //

    // u- = u0 + e
    u1x = ux + e.x;
    u1y = uy + e.y;
    u1z = uz + e.z;

    // gamma^2 = 1 + (u-)^2
    g = sqrt(1 + u1x * u1x + u1y * u1y + u1z * u1z);

    tmp /= g;
    // b = dt qB/2mc
    b.x = b_field.x*tmp;
    b.y = b_field.y*tmp;
    b.z = b_field.z*tmp;

    // u' = u- + [u-, b]
    wx = u1x + (u1y * b.z - u1z * b.y);
    wy = u1y + (u1z * b.x - u1x * b.z);
    wz = u1z + (u1x * b.y - u1y * b.x);

    tmp = 2 / (1 + b.x * b.x + b.y * b.y + b.z * b.z);

    // u+ = u- + 2 * [u, b] / (1 + b^2)
    u1x += (wy * b.z - wz * b.y) * tmp;
    u1y += (wz * b.x - wx * b.z) * tmp;
    u1z += (wx * b.y - wy * b.x) * tmp;

    // u1 = u+ + e
    ux = u1x + e.x;
    uy = u1y + e.y;
    uz = u1z + e.z;

    g = sqrt(1 + ux * ux + uy * uy + uz * uz);
}